

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

int fy_document_resolve(fy_document *fyd)

{
  _Bool _Var1;
  int local_1c;
  _Bool ret;
  int rc;
  fy_document *fyd_local;
  
  if (fyd == (fy_document *)0x0) {
    fyd_local._4_4_ = 0;
  }
  else {
    fy_node_clear_system_marks(fyd->root);
    _Var1 = fy_check_ref_loop(fyd,fyd->root,FYNWF_FOLLOW,(fy_node_walk_ctx *)0x0);
    fy_node_clear_system_marks(fyd->root);
    if (_Var1) {
      local_1c = -1;
    }
    else {
      local_1c = fy_resolve_anchor_node(fyd,fyd->root);
      if (local_1c == 0) {
        fy_resolve_parent_node(fyd,fyd->root,(fy_node *)0x0);
        return 0;
      }
    }
    fyd->diag->field_0x3c = fyd->diag->field_0x3c & 0xfe;
    fyd_local._4_4_ = local_1c;
  }
  return fyd_local._4_4_;
}

Assistant:

int fy_document_resolve(struct fy_document *fyd) {
    int rc;
    bool ret;

    if (!fyd)
        return 0;

    fy_node_clear_system_marks(fyd->root);

    /* for resolution to work, no reference loops should exist */
    ret = fy_check_ref_loop(fyd, fyd->root,
                            FYNWF_MAXDEPTH_DEFAULT | FYNWF_FOLLOW, NULL);

    fy_node_clear_system_marks(fyd->root);

    if (ret)
        goto err_out;


    /* now resolve any anchor nodes */
    rc = fy_resolve_anchor_node(fyd, fyd->root);
    if (rc)
        goto err_out_rc;

    /* redo parent resolution */
    fy_resolve_parent_node(fyd, fyd->root, NULL);

    return 0;

    err_out:
    rc = -1;
    err_out_rc:
    fyd->diag->on_error = false;
    return rc;
}